

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void add_include_stream(c2m_ctx_t c2m_ctx,char *fname,char *content,pos_t err_pos)

{
  pre_ctx *ppVar1;
  int iVar2;
  size_t sVar3;
  char_ptr_t __s2;
  ulong local_48;
  size_t i;
  FILE *f;
  pre_ctx_t pre_ctx;
  char *content_local;
  char *fname_local;
  c2m_ctx_t c2m_ctx_local;
  pos_t err_pos_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  for (local_48 = 0; sVar3 = VARR_char_ptr_tlength(ppVar1->once_include_files), local_48 < sVar3;
      local_48 = local_48 + 1) {
    __s2 = VARR_char_ptr_tget(ppVar1->once_include_files,local_48);
    iVar2 = strcmp(fname,__s2);
    if (iVar2 == 0) {
      return;
    }
  }
  if (fname != (char *)0x0) {
    if ((content == (char *)0x0) && (i = (size_t)fopen(fname,"rb"), (FILE *)i == (FILE *)0x0)) {
      if (c2m_ctx->options->message_file != (FILE *)0x0) {
        error(c2m_ctx,0x1d7d9e,err_pos.fname,err_pos._8_8_,fname);
      }
      longjmp((__jmp_buf_tag *)c2m_ctx->env,1);
    }
    if (content == (char *)0x0) {
      add_stream(c2m_ctx,(FILE *)i,fname,(_func_int_c2m_ctx_t *)0x0);
    }
    else {
      add_string_stream(c2m_ctx,fname,content);
    }
    sVar3 = VARR_ifstate_tlength(ppVar1->ifs);
    c2m_ctx->cs->ifs_length_at_stream_start = (int)sVar3;
    return;
  }
  __assert_fail("fname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
}

Assistant:

static void add_include_stream (c2m_ctx_t c2m_ctx, const char *fname, const char *content,
                                pos_t err_pos) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  FILE *f;

  for (size_t i = 0; i < VARR_LENGTH (char_ptr_t, once_include_files); i++)
    if (strcmp (fname, VARR_GET (char_ptr_t, once_include_files, i)) == 0) return;
  assert (fname != NULL);
  if (content == NULL && (f = fopen (fname, "rb")) == NULL) {
    if (c2m_options->message_file != NULL)
      error (c2m_ctx, err_pos, "error in opening file %s", fname);
    longjmp (c2m_ctx->env, 1);  // ???
  }
  if (content == NULL)
    add_stream (c2m_ctx, f, fname, NULL);
  else
    add_string_stream (c2m_ctx, fname, content);
  cs->ifs_length_at_stream_start = (int) VARR_LENGTH (ifstate_t, ifs);
}